

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O2

void __thiscall
dynamicgraph::TracerRealTime::openFile(TracerRealTime *this,SignalBase<int> *sig,string *givenname)

{
  ofstream *this_00;
  OutStringStream *this_01;
  ExceptionTraces *this_02;
  ErrorCodeEnum local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ofstream *newfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string filename;
  string signame;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  signame._M_dataplus._M_p = (pointer)&signame.field_2;
  signame._M_string_length = 0;
  signame.field_2._M_local_buf[0] = '\0';
  if (givenname->_M_string_length == 0) {
    SignalBase<int>::shortName_abi_cxx11_(&filename,sig);
    std::__cxx11::string::operator=((string *)&signame,(string *)&filename);
    std::__cxx11::string::~string((string *)&filename);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&signame);
  }
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x128);
  std::operator+(&local_c8,&local_a0,&signame);
  std::operator+(&filename,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->field_0x148);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  this_00 = (ofstream *)operator_new(0x200);
  std::ofstream::ofstream(this_00,filename._M_dataplus._M_p,_S_out);
  newfile = (ofstream *)this_00;
  if (*(int *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x20) == 0) {
    std::__cxx11::
    list<std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_*>_>
    ::push_back(&this->hardFiles,&newfile);
    this_01 = (OutStringStream *)operator_new(0x1b8);
    OutStringStream::OutStringStream(this_01);
    local_c8._M_dataplus._M_p = (pointer)(long)this->bufferSize;
    OutStringStream::resize(this_01,(streamsize *)&local_c8);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this_01->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                field_0x90);
    local_c8._M_dataplus._M_p = (pointer)this_01;
    std::__cxx11::
    list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ::push_back((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 *)&this->field_0x190,(value_type *)&local_c8);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&signame);
    return;
  }
  (**(code **)(*(long *)this_00 + 8))(this_00);
  this_02 = (ExceptionTraces *)__cxa_allocate_exception(0x30);
  local_cc = NOT_OPEN;
  std::operator+(&local_40,"Could not open file ",&filename);
  std::operator+(&local_a0,&local_40," for signal ");
  std::operator+(&local_c8,&local_a0,&signame);
  dynamicgraph::ExceptionTraces::ExceptionTraces(this_02,&local_cc,(string *)&local_c8,"");
  __cxa_throw(this_02,&ExceptionTraces::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

void TracerRealTime::openFile(const SignalBase<int> &sig,
                              const std::string &givenname) {
  dgDEBUGIN(15);
  string signame;
  if (givenname.length()) {
    signame = givenname;
  } else {
    signame = sig.shortName();
  }

  string filename = rootdir + basename + signame + suffix;
  dgDEBUG(5) << "Sig <" << sig.getName() << ">: new file " << filename << endl;
  std::ofstream *newfile = new std::ofstream(filename.c_str());
  if (!newfile->good()) {
    delete newfile;
    DG_THROW ExceptionTraces(
        ExceptionTraces::NOT_OPEN,
        "Could not open file " + filename + " for signal " + signame, "");
  }
  dgDEBUG(5) << "Newfile:" << (void *)newfile << endl;
  hardFiles.push_back(newfile);
  dgDEBUG(5) << "Creating Outstringstream" << endl;

  // std::stringstream * newbuffer = new std::stringstream ();
  OutStringStream *newbuffer = new OutStringStream();  // std::stringstream ();
  newbuffer->resize(bufferSize);
  newbuffer->givenname = givenname;
  files.push_back(newbuffer);

  dgDEBUGOUT(15);
}